

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O2

void on_close(intptr_t uuid,fio_protocol_s *_ws)

{
  buffer_s buff;
  subscription_s *s;
  fio_lock_i ret;
  
  if ((code *)_ws[1].rsv != (code *)0x0) {
    (*(code *)_ws[1].rsv)(_ws[1].on_data,_ws[2].on_data);
  }
  if (_ws[3].on_close != (_func_void_intptr_t_fio_protocol_s_ptr *)0x0) {
    fiobj_free((FIOBJ)_ws[3].on_close);
  }
  fio_lock((fio_lock_i *)&_ws[2].rsv);
  while ((_func_uint8_t_intptr_t_fio_protocol_s_ptr **)_ws[2].on_close != &_ws[2].on_shutdown) {
    s = (subscription_s *)fio_ls_remove((fio_ls_s *)_ws[2].on_shutdown);
    fio_unsubscribe(s);
  }
  LOCK();
  *(undefined1 *)&_ws[2].rsv = 0;
  UNLOCK();
  buff.data = _ws[3].on_data;
  buff.size = (size_t)_ws[3].on_ready;
  free_ws_buffer((ws_s *)_ws,buff);
  free(_ws);
  return;
}

Assistant:

static void on_close(intptr_t uuid, fio_protocol_s *_ws) {
  destroy_ws((ws_s *)_ws);
  (void)uuid;
}